

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_search.cpp
# Opt level: O0

void __thiscall LoopSearch::build_map(LoopSearch *this)

{
  Function *this_00;
  bool bVar1;
  reference ppFVar2;
  list<BasicBlock_*,_std::allocator<BasicBlock_*>_> *this_01;
  reference ppBVar3;
  Loop *pLVar4;
  mapped_type *ppLVar5;
  set<Loop_*,_std::less<Loop_*>,_std::allocator<Loop_*>_> local_d8;
  BasicBlock *local_a8;
  BasicBlock *bb;
  iterator __end2;
  iterator __begin2;
  list<BasicBlock_*,_std::allocator<BasicBlock_*>_> *__range2;
  map<BasicBlock_*,_Loop_*,_std::less<BasicBlock_*>,_std::allocator<std::pair<BasicBlock_*const,_Loop_*>_>_>
  _sub_map;
  Function *f;
  iterator __end1;
  iterator __begin1;
  list<Function_*,_std::allocator<Function_*>_> *__range1;
  LoopSearch *this_local;
  
  Module::get_functions_abi_cxx11_
            ((list<Function_*,_std::allocator<Function_*>_> *)&__begin1,(this->super_Pass).m_);
  __end1 = std::__cxx11::list<Function_*,_std::allocator<Function_*>_>::begin
                     ((list<Function_*,_std::allocator<Function_*>_> *)&__begin1);
  f = (Function *)
      std::__cxx11::list<Function_*,_std::allocator<Function_*>_>::end
                ((list<Function_*,_std::allocator<Function_*>_> *)&__begin1);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&f), bVar1) {
    ppFVar2 = std::_List_iterator<Function_*>::operator*(&__end1);
    this_00 = *ppFVar2;
    bVar1 = Function::is_declaration(this_00);
    if (!bVar1) {
      std::
      map<BasicBlock_*,_Loop_*,_std::less<BasicBlock_*>,_std::allocator<std::pair<BasicBlock_*const,_Loop_*>_>_>
      ::map((map<BasicBlock_*,_Loop_*,_std::less<BasicBlock_*>,_std::allocator<std::pair<BasicBlock_*const,_Loop_*>_>_>
             *)&__range2);
      this_01 = Function::get_basic_blocks_abi_cxx11_(this_00);
      __end2 = std::__cxx11::list<BasicBlock_*,_std::allocator<BasicBlock_*>_>::begin(this_01);
      bb = (BasicBlock *)
           std::__cxx11::list<BasicBlock_*,_std::allocator<BasicBlock_*>_>::end(this_01);
      while (bVar1 = std::operator!=(&__end2,(_Self *)&bb), bVar1) {
        ppBVar3 = std::_List_iterator<BasicBlock_*>::operator*(&__end2);
        local_a8 = *ppBVar3;
        get_loop(&local_d8,this,this_00);
        pLVar4 = get_inner_loop(this,&local_d8,local_a8);
        ppLVar5 = std::
                  map<BasicBlock_*,_Loop_*,_std::less<BasicBlock_*>,_std::allocator<std::pair<BasicBlock_*const,_Loop_*>_>_>
                  ::operator[]((map<BasicBlock_*,_Loop_*,_std::less<BasicBlock_*>,_std::allocator<std::pair<BasicBlock_*const,_Loop_*>_>_>
                                *)&__range2,&local_a8);
        *ppLVar5 = pLVar4;
        std::set<Loop_*,_std::less<Loop_*>,_std::allocator<Loop_*>_>::~set(&local_d8);
        std::_List_iterator<BasicBlock_*>::operator++(&__end2);
      }
      std::
      map<BasicBlock_*,_Loop_*,_std::less<BasicBlock_*>,_std::allocator<std::pair<BasicBlock_*const,_Loop_*>_>_>
      ::~map((map<BasicBlock_*,_Loop_*,_std::less<BasicBlock_*>,_std::allocator<std::pair<BasicBlock_*const,_Loop_*>_>_>
              *)&__range2);
    }
    std::_List_iterator<Function_*>::operator++(&__end1);
  }
  std::__cxx11::list<Function_*,_std::allocator<Function_*>_>::~list
            ((list<Function_*,_std::allocator<Function_*>_> *)&__begin1);
  return;
}

Assistant:

void LoopSearch::build_map() {
    for (auto f: m_->get_functions()) {
        if (f->is_declaration()) continue;
        std::map<BasicBlock *, Loop *> _sub_map;
        for (auto bb: f->get_basic_blocks()) {
            _sub_map[bb] = get_inner_loop(get_loop(f), bb);
        }
    }
}